

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmExportInstallFileGenerator::FindNamespaces
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  long *plVar1;
  pointer __s1;
  size_t __n;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range2;
  long *plVar5;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (gg->ExportSets).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 ==
        &(gg->ExportSets).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    plVar4 = *(long **)(p_Var3 + 2);
    plVar5 = (long *)*plVar4;
    plVar1 = (long *)plVar4[1];
    if (plVar5 != plVar1) break;
LAB_00387eab:
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  __s1 = (name->_M_dataplus)._M_p;
  __n = name->_M_string_length;
LAB_00387e82:
  if ((__n != ((undefined8 *)*plVar5)[1]) ||
     ((__n != 0 && (iVar2 = bcmp(__s1,*(void **)*plVar5,__n), iVar2 != 0)))) goto LAB_00387ea2;
  plVar5 = (long *)plVar4[8];
  for (plVar4 = (long *)plVar4[7]; plVar4 != plVar5; plVar4 = plVar4 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(*plVar4 + 0x100));
  }
  goto LAB_00387eab;
LAB_00387ea2:
  plVar5 = plVar5 + 1;
  if (plVar5 == plVar1) goto LAB_00387eab;
  goto LAB_00387e82;
}

Assistant:

std::vector<std::string> cmExportInstallFileGenerator::FindNamespaces(
  cmGlobalGenerator* gg, const std::string& name)
{
  std::vector<std::string> namespaces;
  const cmExportSetMap& exportSets = gg->GetExportSets();

  for (auto const& expIt : exportSets) {
    const cmExportSet* exportSet = expIt.second;
    std::vector<cmTargetExport*> const* targets =
      exportSet->GetTargetExports();

    bool containsTarget = false;
    for (cmTargetExport* target : *targets) {
      if (name == target->TargetName) {
        containsTarget = true;
        break;
      }
    }

    if (containsTarget) {
      std::vector<cmInstallExportGenerator const*> const* installs =
        exportSet->GetInstallations();
      for (cmInstallExportGenerator const* install : *installs) {
        namespaces.push_back(install->GetNamespace());
      }
    }
  }

  return namespaces;
}